

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O1

void ImFontAtlasBuildFinish(ImFontAtlas *atlas)

{
  size_t sVar1;
  float fVar2;
  float x0;
  float y0;
  ImVec2 IVar3;
  ushort uVar4;
  ushort uVar5;
  ImFont *pIVar6;
  ImFont **ppIVar7;
  uint uVar8;
  uint *puVar9;
  ulong uVar10;
  int off_y_1;
  long lVar11;
  uchar *puVar12;
  uint *puVar13;
  uint uVar14;
  int off_x;
  ulong uVar15;
  char *pcVar16;
  ImFontAtlasCustomRect *pIVar17;
  int off_y;
  int iVar18;
  uint uVar19;
  uint uVar20;
  int off_y_2;
  int off_x_2;
  int iVar21;
  size_t __n;
  long lVar22;
  int iVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  float fVar29;
  int iVar31;
  undefined1 auVar30 [16];
  undefined1 auVar32 [16];
  long local_48;
  
  iVar21 = atlas->PackIdMouseCursors;
  pIVar17 = (atlas->CustomRects).Data;
  lVar11 = (long)atlas->TexWidth;
  uVar10 = (ulong)pIVar17[iVar21].X;
  if ((atlas->Flags & 2) == 0) {
    uVar15 = (ulong)pIVar17[iVar21].Y;
    if (atlas->TexPixelsAlpha8 == (uchar *)0x0) {
      puVar9 = atlas->TexPixelsRGBA32;
      puVar13 = puVar9 + (ulong)pIVar17[iVar21].X + lVar11 * uVar15;
      pcVar16 = 
      "..-         -XXXXXXX-    X    -           X           -XXXXXXX          -          XXXXXXX-     XX          - XX       XX ..-         -X.....X-   X.X   -          X.X          -X.....X          -          X.....X-    X..X         -X..X     X..X---         -XXX.XXX-  X...X  -         X...X         -X....X           -           X....X-    X..X         -X...X   X...XX           -  X.X  - X.....X -        X.....X        -X...X            -            X...X-    X..X         - X...X X...X XX          -  X.X  -X.......X-       X.......X       -X..X.X           -           X.X..X-    X..X         -  X...X...X  X.X         -  X.X  -XXXX.XXXX-       XXXX.XXXX       -X.X X.X          -          X.X X.X-    X..XXX       -   X.....X   X..X        -  X.X  -   X.X   -          X.X          -XX   X.X         -         X.X   XX-    X..X..XXX    -    X...X    X...X       -  X.X  -   X.X   -    XX    X.X    XX    -      X.X        -        X.X      -    X..X..X..XX  -     X.X     X....X      -  X.X  -   X.X   -   X.X    X.X    X.X   -       X.X       -       X.X       -    X..X..X..X.X -    X...X    X.....X     -  X.X  -   X.X   -  X..X    X.X    X..X  -        X.X      -      X.X        -XXX X..X..X..X..X-   X.....X   X......X    -  X.X  -   X.X   - X...XXXXXX.XXXXXX...X -         X.X   XX-XX   X.X         -X..XX........X..X-  X...X...X  X.......X   -  X.X  -   X.X   -X.....................X-          X.X X.X-X.X X.X          -X...X...........X- X...X X...X X........X  -  X.X  -   X.X   - X...XXXXXX.XXXXXX...X -           X.X..X-X..X.X           - X..............X-X...X   X...XX.........X -XXX.XXX-   X.X   -  X..X    X.X    X..X  -            X...X-X...X            -  X.............X-X..X     X..XX..........X-X.....X-   X.X   -   X.X    X.X    X.X   -           X....X-X....X           -  X.............X- XX       XX X......XXXXX-XXXXXXX-   X.X   -    XX    X.X    XX    -          X.....X-X.....X          -   X............X--------------X...X..X    ---------   X.X   -          X.X          -          XXXXXXX-XXXXXXX          -   X...." /* TRUNCATED STRING LITERAL */
      ;
      iVar18 = 0;
      do {
        lVar11 = 0;
        do {
          puVar13[lVar11] = -(uint)(pcVar16[lVar11] == '.');
          lVar11 = lVar11 + 1;
        } while (lVar11 != 0x7a);
        iVar18 = iVar18 + 1;
        puVar13 = puVar13 + atlas->TexWidth;
        pcVar16 = pcVar16 + 0x7a;
      } while (iVar18 != 0x1b);
      puVar9 = puVar9 + uVar10 + 0x7b + (long)atlas->TexWidth * uVar15;
      pcVar16 = 
      "..-         -XXXXXXX-    X    -           X           -XXXXXXX          -          XXXXXXX-     XX          - XX       XX ..-         -X.....X-   X.X   -          X.X          -X.....X          -          X.....X-    X..X         -X..X     X..X---         -XXX.XXX-  X...X  -         X...X         -X....X           -           X....X-    X..X         -X...X   X...XX           -  X.X  - X.....X -        X.....X        -X...X            -            X...X-    X..X         - X...X X...X XX          -  X.X  -X.......X-       X.......X       -X..X.X           -           X.X..X-    X..X         -  X...X...X  X.X         -  X.X  -XXXX.XXXX-       XXXX.XXXX       -X.X X.X          -          X.X X.X-    X..XXX       -   X.....X   X..X        -  X.X  -   X.X   -          X.X          -XX   X.X         -         X.X   XX-    X..X..XXX    -    X...X    X...X       -  X.X  -   X.X   -    XX    X.X    XX    -      X.X        -        X.X      -    X..X..X..XX  -     X.X     X....X      -  X.X  -   X.X   -   X.X    X.X    X.X   -       X.X       -       X.X       -    X..X..X..X.X -    X...X    X.....X     -  X.X  -   X.X   -  X..X    X.X    X..X  -        X.X      -      X.X        -XXX X..X..X..X..X-   X.....X   X......X    -  X.X  -   X.X   - X...XXXXXX.XXXXXX...X -         X.X   XX-XX   X.X         -X..XX........X..X-  X...X...X  X.......X   -  X.X  -   X.X   -X.....................X-          X.X X.X-X.X X.X          -X...X...........X- X...X X...X X........X  -  X.X  -   X.X   - X...XXXXXX.XXXXXX...X -           X.X..X-X..X.X           - X..............X-X...X   X...XX.........X -XXX.XXX-   X.X   -  X..X    X.X    X..X  -            X...X-X...X            -  X.............X-X..X     X..XX..........X-X.....X-   X.X   -   X.X    X.X    X.X   -           X....X-X....X           -  X.............X- XX       XX X......XXXXX-XXXXXXX-   X.X   -    XX    X.X    XX    -          X.....X-X.....X          -   X............X--------------X...X..X    ---------   X.X   -          X.X          -          XXXXXXX-XXXXXXX          -   X...." /* TRUNCATED STRING LITERAL */
      ;
      iVar18 = 0;
      do {
        lVar11 = 0;
        do {
          puVar9[lVar11] = -(uint)(pcVar16[lVar11] == 'X');
          lVar11 = lVar11 + 1;
        } while (lVar11 != 0x7a);
        iVar18 = iVar18 + 1;
        puVar9 = puVar9 + atlas->TexWidth;
        pcVar16 = pcVar16 + 0x7a;
      } while (iVar18 != 0x1b);
    }
    else {
      puVar12 = atlas->TexPixelsAlpha8 + lVar11 * uVar15 + uVar10;
      pcVar16 = 
      "..-         -XXXXXXX-    X    -           X           -XXXXXXX          -          XXXXXXX-     XX          - XX       XX ..-         -X.....X-   X.X   -          X.X          -X.....X          -          X.....X-    X..X         -X..X     X..X---         -XXX.XXX-  X...X  -         X...X         -X....X           -           X....X-    X..X         -X...X   X...XX           -  X.X  - X.....X -        X.....X        -X...X            -            X...X-    X..X         - X...X X...X XX          -  X.X  -X.......X-       X.......X       -X..X.X           -           X.X..X-    X..X         -  X...X...X  X.X         -  X.X  -XXXX.XXXX-       XXXX.XXXX       -X.X X.X          -          X.X X.X-    X..XXX       -   X.....X   X..X        -  X.X  -   X.X   -          X.X          -XX   X.X         -         X.X   XX-    X..X..XXX    -    X...X    X...X       -  X.X  -   X.X   -    XX    X.X    XX    -      X.X        -        X.X      -    X..X..X..XX  -     X.X     X....X      -  X.X  -   X.X   -   X.X    X.X    X.X   -       X.X       -       X.X       -    X..X..X..X.X -    X...X    X.....X     -  X.X  -   X.X   -  X..X    X.X    X..X  -        X.X      -      X.X        -XXX X..X..X..X..X-   X.....X   X......X    -  X.X  -   X.X   - X...XXXXXX.XXXXXX...X -         X.X   XX-XX   X.X         -X..XX........X..X-  X...X...X  X.......X   -  X.X  -   X.X   -X.....................X-          X.X X.X-X.X X.X          -X...X...........X- X...X X...X X........X  -  X.X  -   X.X   - X...XXXXXX.XXXXXX...X -           X.X..X-X..X.X           - X..............X-X...X   X...XX.........X -XXX.XXX-   X.X   -  X..X    X.X    X..X  -            X...X-X...X            -  X.............X-X..X     X..XX..........X-X.....X-   X.X   -   X.X    X.X    X.X   -           X....X-X....X           -  X.............X- XX       XX X......XXXXX-XXXXXXX-   X.X   -    XX    X.X    XX    -          X.....X-X.....X          -   X............X--------------X...X..X    ---------   X.X   -          X.X          -          XXXXXXX-XXXXXXX          -   X...." /* TRUNCATED STRING LITERAL */
      ;
      iVar18 = 0;
      do {
        lVar11 = 0;
        do {
          puVar12[lVar11] = -(pcVar16[lVar11] == '.');
          lVar11 = lVar11 + 1;
        } while (lVar11 != 0x7a);
        iVar18 = iVar18 + 1;
        puVar12 = puVar12 + atlas->TexWidth;
        pcVar16 = pcVar16 + 0x7a;
      } while (iVar18 != 0x1b);
      puVar12 = atlas->TexPixelsAlpha8 +
                (long)atlas->TexWidth * (ulong)pIVar17[iVar21].Y + uVar10 + 0x7b;
      pcVar16 = 
      "..-         -XXXXXXX-    X    -           X           -XXXXXXX          -          XXXXXXX-     XX          - XX       XX ..-         -X.....X-   X.X   -          X.X          -X.....X          -          X.....X-    X..X         -X..X     X..X---         -XXX.XXX-  X...X  -         X...X         -X....X           -           X....X-    X..X         -X...X   X...XX           -  X.X  - X.....X -        X.....X        -X...X            -            X...X-    X..X         - X...X X...X XX          -  X.X  -X.......X-       X.......X       -X..X.X           -           X.X..X-    X..X         -  X...X...X  X.X         -  X.X  -XXXX.XXXX-       XXXX.XXXX       -X.X X.X          -          X.X X.X-    X..XXX       -   X.....X   X..X        -  X.X  -   X.X   -          X.X          -XX   X.X         -         X.X   XX-    X..X..XXX    -    X...X    X...X       -  X.X  -   X.X   -    XX    X.X    XX    -      X.X        -        X.X      -    X..X..X..XX  -     X.X     X....X      -  X.X  -   X.X   -   X.X    X.X    X.X   -       X.X       -       X.X       -    X..X..X..X.X -    X...X    X.....X     -  X.X  -   X.X   -  X..X    X.X    X..X  -        X.X      -      X.X        -XXX X..X..X..X..X-   X.....X   X......X    -  X.X  -   X.X   - X...XXXXXX.XXXXXX...X -         X.X   XX-XX   X.X         -X..XX........X..X-  X...X...X  X.......X   -  X.X  -   X.X   -X.....................X-          X.X X.X-X.X X.X          -X...X...........X- X...X X...X X........X  -  X.X  -   X.X   - X...XXXXXX.XXXXXX...X -           X.X..X-X..X.X           - X..............X-X...X   X...XX.........X -XXX.XXX-   X.X   -  X..X    X.X    X..X  -            X...X-X...X            -  X.............X-X..X     X..XX..........X-X.....X-   X.X   -   X.X    X.X    X.X   -           X....X-X....X           -  X.............X- XX       XX X......XXXXX-XXXXXXX-   X.X   -    XX    X.X    XX    -          X.....X-X.....X          -   X............X--------------X...X..X    ---------   X.X   -          X.X          -          XXXXXXX-XXXXXXX          -   X...." /* TRUNCATED STRING LITERAL */
      ;
      iVar18 = 0;
      do {
        lVar11 = 0;
        do {
          puVar12[lVar11] = -(pcVar16[lVar11] == 'X');
          lVar11 = lVar11 + 1;
        } while (lVar11 != 0x7a);
        iVar18 = iVar18 + 1;
        puVar12 = puVar12 + atlas->TexWidth;
        pcVar16 = pcVar16 + 0x7a;
      } while (iVar18 != 0x1b);
    }
  }
  else {
    lVar22 = (ulong)pIVar17[iVar21].Y * lVar11 + uVar10;
    iVar18 = (int)lVar22;
    if (atlas->TexPixelsAlpha8 == (uchar *)0x0) {
      puVar9 = atlas->TexPixelsRGBA32;
      puVar13 = puVar9 + (atlas->TexWidth + iVar18);
      puVar13[0] = 0xffffffff;
      puVar13[1] = 0xffffffff;
      puVar9 = puVar9 + iVar18;
      puVar9[0] = 0xffffffff;
      puVar9[1] = 0xffffffff;
    }
    else {
      lVar11 = iVar18 + lVar11;
      atlas->TexPixelsAlpha8[lVar11 + 1] = 0xff;
      atlas->TexPixelsAlpha8[lVar11] = 0xff;
      atlas->TexPixelsAlpha8[lVar22 + 1] = 0xff;
      atlas->TexPixelsAlpha8[lVar22] = 0xff;
    }
  }
  uVar8._0_2_ = pIVar17[iVar21].X;
  uVar8._2_2_ = pIVar17[iVar21].Y;
  IVar3 = atlas->TexUvScale;
  (atlas->TexUvWhitePixel).x = IVar3.x * ((float)(uVar8 & 0xffff) + 0.5);
  (atlas->TexUvWhitePixel).y = IVar3.y * ((float)(uVar8 >> 0x10) + 0.5);
  if ((atlas->Flags & 4) == 0) {
    pIVar17 = (atlas->CustomRects).Data + atlas->PackIdLines;
    local_48 = 0;
    iVar21 = 0;
    __n = 0;
    auVar32 = _DAT_001ec3b0;
    do {
      uVar4 = pIVar17->Width;
      iVar18 = (int)__n;
      uVar8 = (uint)uVar4 - iVar18;
      uVar14 = uVar8 >> 1;
      uVar19 = uVar14 + iVar18;
      if (atlas->TexPixelsAlpha8 == (uchar *)0x0) {
        puVar13 = atlas->TexPixelsRGBA32;
        uVar10 = (ulong)(((uint)pIVar17->Y + iVar18) * atlas->TexWidth + (uint)pIVar17->X);
        if (1 < uVar8) {
          uVar8 = (uint)uVar4 + iVar21 >> 1;
          lVar11 = (ulong)(uVar8 + (uVar8 == 0)) - 1;
          auVar24._8_4_ = (int)lVar11;
          auVar24._0_8_ = lVar11;
          auVar24._12_4_ = (int)((ulong)lVar11 >> 0x20);
          lVar11 = 0;
          auVar28 = _DAT_001ec6a0;
          auVar26 = _DAT_001ec690;
          do {
            auVar27 = auVar24 ^ auVar32;
            auVar30 = auVar28 ^ auVar32;
            iVar23 = auVar27._4_4_;
            if ((bool)(~(iVar23 < auVar30._4_4_ ||
                        auVar27._0_4_ < auVar30._0_4_ && auVar30._4_4_ == iVar23) & 1)) {
              *(undefined4 *)((long)puVar13 + lVar11 + uVar10 * 4) = 0xffffff;
            }
            if (auVar30._12_4_ <= auVar27._12_4_ &&
                (auVar30._8_4_ <= auVar27._8_4_ || auVar30._12_4_ != auVar27._12_4_)) {
              *(undefined4 *)((long)puVar13 + lVar11 + uVar10 * 4 + 4) = 0xffffff;
            }
            iVar31 = SUB164(auVar26 ^ auVar32,4);
            if (iVar31 <= iVar23 &&
                (iVar31 != iVar23 || SUB164(auVar26 ^ auVar32,0) <= auVar27._0_4_)) {
              *(undefined4 *)((long)puVar13 + lVar11 + uVar10 * 4 + 8) = 0xffffff;
              *(undefined4 *)((long)puVar13 + lVar11 + uVar10 * 4 + 0xc) = 0xffffff;
            }
            lVar22 = auVar28._8_8_;
            auVar28._0_8_ = auVar28._0_8_ + 4;
            auVar28._8_8_ = lVar22 + 4;
            lVar22 = auVar26._8_8_;
            auVar26._0_8_ = auVar26._0_8_ + 4;
            auVar26._8_8_ = lVar22 + 4;
            lVar11 = lVar11 + 0x10;
          } while ((ulong)(uVar8 + (uVar8 == 0) + 3 & 0xfffffffc) << 2 != lVar11);
        }
        if (__n != 0) {
          memset(puVar13 + uVar10 + uVar14,0xff,__n * 4);
          auVar32 = _DAT_001ec3b0;
        }
        if (uVar4 != uVar19) {
          uVar19 = (uint)uVar4 + iVar21;
          uVar8 = uVar19 >> 1;
          uVar19 = uVar19 - uVar8;
          lVar11 = (ulong)(uVar19 + (uVar19 == 0)) - 1;
          auVar25._8_4_ = (int)lVar11;
          auVar25._0_8_ = lVar11;
          auVar25._12_4_ = (int)((ulong)lVar11 >> 0x20);
          lVar11 = local_48 + (ulong)uVar8 * 4 + uVar10 * 4;
          auVar25 = auVar25 ^ auVar32;
          uVar10 = 0;
          auVar27 = _DAT_001ec6a0;
          auVar30 = _DAT_001ec690;
          do {
            auVar28 = auVar27 ^ auVar32;
            iVar23 = auVar25._4_4_;
            if ((bool)(~(auVar28._4_4_ == iVar23 && auVar25._0_4_ < auVar28._0_4_ ||
                        iVar23 < auVar28._4_4_) & 1)) {
              *(undefined4 *)((long)puVar13 + uVar10 + lVar11) = 0xffffff;
            }
            if ((auVar28._12_4_ != auVar25._12_4_ || auVar28._8_4_ <= auVar25._8_4_) &&
                auVar28._12_4_ <= auVar25._12_4_) {
              *(undefined4 *)((long)puVar13 + uVar10 + lVar11 + 4) = 0xffffff;
            }
            iVar31 = SUB164(auVar30 ^ auVar32,4);
            if (iVar31 <= iVar23 &&
                (iVar31 != iVar23 || SUB164(auVar30 ^ auVar32,0) <= auVar25._0_4_)) {
              *(undefined4 *)((long)puVar13 + uVar10 + lVar11 + 8) = 0xffffff;
              *(undefined4 *)((long)puVar13 + uVar10 + lVar11 + 0xc) = 0xffffff;
            }
            lVar22 = auVar27._8_8_;
            auVar27._0_8_ = auVar27._0_8_ + 4;
            auVar27._8_8_ = lVar22 + 4;
            lVar22 = auVar30._8_8_;
            auVar30._0_8_ = auVar30._0_8_ + 4;
            auVar30._8_8_ = lVar22 + 4;
            uVar10 = uVar10 + 0x10;
          } while ((((ulong)uVar19 + (ulong)((ulong)uVar19 == 0)) * 4 + 0xc & 0x7fffffff0) != uVar10
                  );
        }
      }
      else {
        puVar12 = atlas->TexPixelsAlpha8 +
                  (((uint)pIVar17->Y + iVar18) * atlas->TexWidth + (uint)pIVar17->X);
        if (1 < uVar8) {
          memset(puVar12,0,(ulong)(uVar14 + (uVar14 == 0)));
          auVar32 = _DAT_001ec3b0;
        }
        if (__n != 0) {
          memset(puVar12 + uVar14,0xff,__n);
          auVar32 = _DAT_001ec3b0;
        }
        if (uVar4 != uVar19) {
          iVar23 = uVar4 - uVar19;
          memset(puVar12 + uVar14 + __n,0,(ulong)(iVar23 + (uint)(iVar23 == 0)));
          auVar32 = _DAT_001ec3b0;
        }
      }
      uVar4 = pIVar17->X;
      uVar5 = pIVar17->Y;
      fVar2 = (atlas->TexUvScale).x;
      fVar29 = (atlas->TexUvScale).y;
      sVar1 = __n + 1;
      atlas->TexUvLines[__n].x = (float)((uVar14 + uVar4) - 1) * fVar2;
      fVar29 = ((float)(int)(uVar5 + 1 + iVar18) * fVar29 +
               (float)(int)((uint)uVar5 + iVar18) * fVar29) * 0.5;
      atlas->TexUvLines[__n].y = fVar29;
      atlas->TexUvLines[__n].z = fVar2 * (float)((uint)uVar4 + (int)sVar1 + uVar14);
      atlas->TexUvLines[__n].w = fVar29;
      iVar21 = iVar21 + -1;
      local_48 = local_48 + 4;
      __n = sVar1;
    } while (sVar1 != 0x40);
  }
  if (0 < (atlas->CustomRects).Size) {
    lVar11 = 0;
    lVar22 = 0;
    do {
      pIVar17 = (atlas->CustomRects).Data;
      pIVar6 = *(ImFont **)((long)&pIVar17->Font + lVar11);
      if ((pIVar6 != (ImFont *)0x0) &&
         (iVar21 = *(int *)((long)&pIVar17->GlyphID + lVar11), iVar21 != 0)) {
        uVar8 = (uint)*(ushort *)((long)&pIVar17->X + lVar11);
        fVar2 = (atlas->TexUvScale).x;
        fVar29 = (atlas->TexUvScale).y;
        uVar19 = (uint)*(ushort *)((long)&pIVar17->Y + lVar11);
        uVar20 = (uint)*(ushort *)((long)&pIVar17->Width + lVar11);
        uVar14 = (uint)*(ushort *)((long)&pIVar17->Height + lVar11);
        x0 = *(float *)((long)&(pIVar17->GlyphOffset).x + lVar11);
        y0 = *(float *)((long)&(pIVar17->GlyphOffset).y + lVar11);
        ImFont::AddGlyph(pIVar6,(ImFontConfig *)0x0,(ImWchar)iVar21,x0,y0,(float)uVar20 + x0,
                         (float)uVar14 + y0,(float)uVar8 * fVar2,(float)uVar19 * fVar29,
                         (float)(uVar8 + uVar20) * fVar2,(float)(uVar19 + uVar14) * fVar29,
                         *(float *)((long)&pIVar17->GlyphAdvanceX + lVar11));
      }
      lVar22 = lVar22 + 1;
      lVar11 = lVar11 + 0x20;
    } while (lVar22 < (atlas->CustomRects).Size);
  }
  lVar11 = (long)(atlas->Fonts).Size;
  if (lVar11 != 0) {
    ppIVar7 = (atlas->Fonts).Data;
    lVar22 = 0;
    do {
      pIVar6 = *(ImFont **)((long)ppIVar7 + lVar22);
      if (pIVar6->DirtyLookupTables == true) {
        ImFont::BuildLookupTable(pIVar6);
      }
      lVar22 = lVar22 + 8;
    } while (lVar11 * 8 != lVar22);
  }
  atlas->TexReady = true;
  return;
}

Assistant:

void ImFontAtlasBuildFinish(ImFontAtlas* atlas)
{
    // Render into our custom data blocks
    IM_ASSERT(atlas->TexPixelsAlpha8 != NULL || atlas->TexPixelsRGBA32 != NULL);
    ImFontAtlasBuildRenderDefaultTexData(atlas);
    ImFontAtlasBuildRenderLinesTexData(atlas);

    // Register custom rectangle glyphs
    for (int i = 0; i < atlas->CustomRects.Size; i++)
    {
        const ImFontAtlasCustomRect* r = &atlas->CustomRects[i];
        if (r->Font == NULL || r->GlyphID == 0)
            continue;

        // Will ignore ImFontConfig settings: GlyphMinAdvanceX, GlyphMinAdvanceY, GlyphExtraSpacing, PixelSnapH
        IM_ASSERT(r->Font->ContainerAtlas == atlas);
        ImVec2 uv0, uv1;
        atlas->CalcCustomRectUV(r, &uv0, &uv1);
        r->Font->AddGlyph(NULL, (ImWchar)r->GlyphID, r->GlyphOffset.x, r->GlyphOffset.y, r->GlyphOffset.x + r->Width, r->GlyphOffset.y + r->Height, uv0.x, uv0.y, uv1.x, uv1.y, r->GlyphAdvanceX);
    }

    // Build all fonts lookup tables
    for (ImFont* font : atlas->Fonts)
        if (font->DirtyLookupTables)
            font->BuildLookupTable();

    atlas->TexReady = true;
}